

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall SubcommandProgram_Callbacks_Test::TestBody(SubcommandProgram_Callbacks_Test *this)

{
  bool bVar1;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [16];
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:540:25)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:540:25)>
             ::_M_manager;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).start)->callback_,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  TApp::run((TApp *)this);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  local_58[0].ptr_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_SubcommandProgram).super_TApp.args,local_58,&local_38);
  if (local_58[0].ptr_ != local_48) {
    operator_delete(local_58[0].ptr_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x224,
             "Expected: run() throws an exception of type CLI::Success.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (((local_58[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_58[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_58[0].ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, Callbacks) {

    start->set_callback([]() { throw CLI::Success(); });

    run();

    app.reset();

    args = {"start"};

    EXPECT_THROW(run(), CLI::Success);
}